

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O0

ForwardTypeRestriction slang::ast::SemanticFacts::getTypeRestriction(Type *type)

{
  Type *pTVar1;
  ClassType *pCVar2;
  Type *ct;
  Type *in_stack_ffffffffffffffe0;
  ForwardTypeRestriction local_4;
  
  pTVar1 = Type::getCanonicalType(in_stack_ffffffffffffffe0);
  switch((pTVar1->super_Symbol).kind) {
  case EnumType:
    local_4 = Enum;
    break;
  default:
    local_4 = None;
    break;
  case PackedStructType:
  case UnpackedStructType:
    local_4 = Struct;
    break;
  case PackedUnionType:
  case UnpackedUnionType:
    local_4 = Union;
    break;
  case ClassType:
    pCVar2 = Symbol::as<slang::ast::ClassType>((Symbol *)0x7708db);
    if ((pCVar2->isInterface & 1U) == 0) {
      local_4 = Class;
    }
    else {
      local_4 = InterfaceClass;
    }
  }
  return local_4;
}

Assistant:

ForwardTypeRestriction SemanticFacts::getTypeRestriction(const Type& type) {
    auto& ct = type.getCanonicalType();
    switch (ct.kind) {
        case SymbolKind::PackedStructType:
        case SymbolKind::UnpackedStructType:
            return ForwardTypeRestriction::Struct;
        case SymbolKind::PackedUnionType:
        case SymbolKind::UnpackedUnionType:
            return ForwardTypeRestriction::Union;
        case SymbolKind::EnumType:
            return ForwardTypeRestriction::Enum;
        case SymbolKind::ClassType:
            if (ct.as<ClassType>().isInterface)
                return ForwardTypeRestriction::InterfaceClass;
            return ForwardTypeRestriction::Class;
        default:
            return ForwardTypeRestriction::None;
    }
}